

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_util.h
# Opt level: O0

bool FileExist(char *filename)

{
  int iVar1;
  ostream *this;
  ostream *poVar2;
  char *in_RDI;
  allocator local_71;
  string local_70 [55];
  allocator local_39;
  string local_38 [16];
  string *in_stack_ffffffffffffffd8;
  int in_stack_ffffffffffffffe4;
  string *in_stack_ffffffffffffffe8;
  bool local_1;
  
  iVar1 = access(in_RDI,0);
  if (iVar1 == -1) {
    Logger::Logger((Logger *)&stack0xffffffffffffffec,WARNING);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_38,
               "/workspace/llm4binary/github/license_all_cmakelists_25/etveritas[P]xlearn/src/base/file_util.h"
               ,&local_39);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_70,"FileExist",&local_71);
    this = Logger::Start((LogSeverity)((ulong)in_RDI >> 0x20),in_stack_ffffffffffffffe8,
                         in_stack_ffffffffffffffe4,in_stack_ffffffffffffffd8);
    poVar2 = std::operator<<(this,"File: ");
    poVar2 = std::operator<<(poVar2,in_RDI);
    std::operator<<(poVar2," doesn\'t exists.");
    std::__cxx11::string::~string(local_70);
    std::allocator<char>::~allocator((allocator<char> *)&local_71);
    std::__cxx11::string::~string(local_38);
    std::allocator<char>::~allocator((allocator<char> *)&local_39);
    Logger::~Logger((Logger *)this);
  }
  local_1 = iVar1 != -1;
  return local_1;
}

Assistant:

inline bool FileExist(const char *filename) {
  if (access(filename, F_OK) != -1) {
    return true;
  }
  LOG(WARNING) << "File: " << filename << " doesn't exists.";
  return false;
}